

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ClassSymbols.cpp
# Opt level: O1

void slang::ast::findIfaces
               (ClassType *type,SmallVectorBase<const_slang::ast::Type_*> *ifaces,
               SmallSet<const_slang::ast::Symbol_*,_4UL,_ska::detailv3::sherwood_v3_entry<const_slang::ast::Symbol_*>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<const_slang::ast::Symbol_*>,_4UL>_>
               *visited)

{
  size_type sVar1;
  pointer ppTVar2;
  Type *this;
  ClassType *pCVar3;
  long lVar4;
  pair<ska::detailv3::sherwood_v3_table<const_slang::ast::Symbol_*,_const_slang::ast::Symbol_*,_std::hash<const_slang::ast::Symbol_*>,_ska::detailv3::functor_storage<unsigned_long,_std::hash<const_slang::ast::Symbol_*>_>,_std::equal_to<const_slang::ast::Symbol_*>,_ska::detailv3::functor_storage<bool,_std::equal_to<const_slang::ast::Symbol_*>_>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<const_slang::ast::Symbol_*>,_4UL>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<const_slang::ast::Symbol_*>,_4UL>_>::templated_iterator<const_slang::ast::Symbol_*>,_bool>
  pVar5;
  Type *iface;
  ClassType *local_48;
  ClassType *local_40;
  ClassType *local_38;
  
  if (type->isInterface == true) {
    local_48 = type;
    pVar5 = ska::detailv3::
            sherwood_v3_table<slang::ast::Symbol_const*,slang::ast::Symbol_const*,std::hash<slang::ast::Symbol_const*>,ska::detailv3::functor_storage<unsigned_long,std::hash<slang::ast::Symbol_const*>>,std::equal_to<slang::ast::Symbol_const*>,ska::detailv3::functor_storage<bool,std::equal_to<slang::ast::Symbol_const*>>,slang::StackAllocator<ska::detailv3::sherwood_v3_entry<slang::ast::Symbol_const*>,4ul>,slang::StackAllocator<ska::detailv3::sherwood_v3_entry<slang::ast::Symbol_const*>,4ul>>
            ::emplace<slang::ast::Symbol_const*>
                      ((sherwood_v3_table<slang::ast::Symbol_const*,slang::ast::Symbol_const*,std::hash<slang::ast::Symbol_const*>,ska::detailv3::functor_storage<unsigned_long,std::hash<slang::ast::Symbol_const*>>,std::equal_to<slang::ast::Symbol_const*>,ska::detailv3::functor_storage<bool,std::equal_to<slang::ast::Symbol_const*>>,slang::StackAllocator<ska::detailv3::sherwood_v3_entry<slang::ast::Symbol_const*>,4ul>,slang::StackAllocator<ska::detailv3::sherwood_v3_entry<slang::ast::Symbol_const*>,4ul>>
                        *)&visited->
                           super_flat_hash_set<const_slang::ast::Symbol_*,_std::hash<const_Symbol_*>,_std::equal_to<const_Symbol_*>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<const_slang::ast::Symbol_*>,_4UL>_>
                       ,(Symbol **)&local_48);
    if (((undefined1  [16])pVar5 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
      local_48 = type;
      SmallVectorBase<slang::ast::Type_const*>::emplace_back<slang::ast::Type_const*>
                ((SmallVectorBase<slang::ast::Type_const*> *)ifaces,(Type **)&local_48);
    }
  }
  if ((type->super_Scope).deferredMemberIndex != Invalid) {
    Scope::elaborate(&type->super_Scope);
  }
  sVar1 = (type->implementsIfaces).size_;
  local_40 = type;
  if (sVar1 != 0) {
    ppTVar2 = (type->implementsIfaces).data_;
    lVar4 = 0;
    do {
      local_48 = *(ClassType **)((long)ppTVar2 + lVar4);
      local_38 = local_48;
      pVar5 = ska::detailv3::
              sherwood_v3_table<slang::ast::Symbol_const*,slang::ast::Symbol_const*,std::hash<slang::ast::Symbol_const*>,ska::detailv3::functor_storage<unsigned_long,std::hash<slang::ast::Symbol_const*>>,std::equal_to<slang::ast::Symbol_const*>,ska::detailv3::functor_storage<bool,std::equal_to<slang::ast::Symbol_const*>>,slang::StackAllocator<ska::detailv3::sherwood_v3_entry<slang::ast::Symbol_const*>,4ul>,slang::StackAllocator<ska::detailv3::sherwood_v3_entry<slang::ast::Symbol_const*>,4ul>>
              ::emplace<slang::ast::Symbol_const*>
                        ((sherwood_v3_table<slang::ast::Symbol_const*,slang::ast::Symbol_const*,std::hash<slang::ast::Symbol_const*>,ska::detailv3::functor_storage<unsigned_long,std::hash<slang::ast::Symbol_const*>>,std::equal_to<slang::ast::Symbol_const*>,ska::detailv3::functor_storage<bool,std::equal_to<slang::ast::Symbol_const*>>,slang::StackAllocator<ska::detailv3::sherwood_v3_entry<slang::ast::Symbol_const*>,4ul>,slang::StackAllocator<ska::detailv3::sherwood_v3_entry<slang::ast::Symbol_const*>,4ul>>
                          *)&visited->
                             super_flat_hash_set<const_slang::ast::Symbol_*,_std::hash<const_Symbol_*>,_std::equal_to<const_Symbol_*>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<const_slang::ast::Symbol_*>,_4UL>_>
                         ,(Symbol **)&local_48);
      if (((undefined1  [16])pVar5 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
        SmallVectorBase<slang::ast::Type_const*>::emplace_back<slang::ast::Type_const*const&>
                  ((SmallVectorBase<slang::ast::Type_const*> *)ifaces,(Type **)&local_38);
      }
      lVar4 = lVar4 + 8;
    } while (sVar1 << 3 != lVar4);
  }
  pCVar3 = local_40;
  if ((local_40->super_Scope).deferredMemberIndex != Invalid) {
    Scope::elaborate(&local_40->super_Scope);
  }
  this = pCVar3->baseClass;
  if (this != (Type *)0x0) {
    if (this->canonical == (Type *)0x0) {
      Type::resolveCanonical(this);
    }
    if ((this->canonical->super_Symbol).kind != ErrorType) {
      if ((((ClassType *)this->canonical)->super_Type).super_Symbol.kind != ClassType) {
        assert::assertFailed
                  ("T::isKind(kind)",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/extern/slang/source/../include/slang/ast/Symbol.h"
                   ,0xc4,"decltype(auto) slang::ast::Symbol::as() [T = slang::ast::ClassType]");
      }
      findIfaces((ClassType *)this->canonical,ifaces,visited);
    }
  }
  return;
}

Assistant:

static void findIfaces(const ClassType& type, SmallVectorBase<const Type*>& ifaces,
                       SmallSet<const Symbol*, 4>& visited) {
    if (type.isInterface) {
        if (visited.emplace(&type).second)
            ifaces.push_back(&type);
    }

    for (auto iface : type.getImplementedInterfaces()) {
        if (visited.emplace(iface).second)
            ifaces.push_back(iface);
    }

    if (auto base = type.getBaseClass(); base && !base->isError())
        findIfaces(base->getCanonicalType().as<ClassType>(), ifaces, visited);
}